

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_logical_operator.cpp
# Opt level: O2

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::LogicalComparisonJoin::Deserialize(LogicalComparisonJoin *this,Deserializer *deserializer)

{
  JoinType join_type;
  LogicalOperatorType logical_type;
  LogicalComparisonJoin *this_00;
  pointer pLVar1;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::LogicalComparisonJoin_*,_false> local_28;
  
  join_type = Deserializer::ReadProperty<duckdb::JoinType>(deserializer,200,"join_type");
  this_00 = (LogicalComparisonJoin *)operator_new(0x118);
  logical_type = SerializationData::Get<duckdb::LogicalOperatorType>(&deserializer->data);
  LogicalComparisonJoin(this_00,join_type,logical_type);
  local_28._M_head_impl = this_00;
  pLVar1 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
           ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                         *)&local_28);
  Deserializer::ReadPropertyWithDefault<unsigned_long>
            (deserializer,0xc9,"mark_index",&(pLVar1->super_LogicalJoin).mark_index);
  pLVar1 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
           ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                         *)&local_28);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<unsigned_long,true>>
            (deserializer,0xca,"left_projection_map",
             &(pLVar1->super_LogicalJoin).left_projection_map);
  pLVar1 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
           ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                         *)&local_28);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<unsigned_long,true>>
            (deserializer,0xcb,"right_projection_map",
             &(pLVar1->super_LogicalJoin).right_projection_map);
  pLVar1 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
           ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                         *)&local_28);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<duckdb::JoinCondition,true>>
            (deserializer,0xcc,"conditions",&pLVar1->conditions);
  pLVar1 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
           ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                         *)&local_28);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<duckdb::LogicalType,true>>
            (deserializer,0xcd,"mark_types",&pLVar1->mark_types);
  pLVar1 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
           ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                         *)&local_28);
  Deserializer::
  ReadPropertyWithDefault<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>>
            (deserializer,0xce,"duplicate_eliminated_columns",&pLVar1->duplicate_eliminated_columns)
  ;
  pLVar1 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
           ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                         *)&local_28);
  Deserializer::ReadPropertyWithExplicitDefault<bool>
            (deserializer,0xcf,"delim_flipped",&pLVar1->delim_flipped,false);
  pLVar1 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
           ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                         *)&local_28);
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
            (deserializer,0xd0,"predicate",&pLVar1->predicate);
  (this->super_LogicalJoin).super_LogicalOperator._vptr_LogicalOperator =
       (_func_int **)local_28._M_head_impl;
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)this;
}

Assistant:

unique_ptr<LogicalOperator> LogicalComparisonJoin::Deserialize(Deserializer &deserializer) {
	auto join_type = deserializer.ReadProperty<JoinType>(200, "join_type");
	auto result = duckdb::unique_ptr<LogicalComparisonJoin>(new LogicalComparisonJoin(join_type, deserializer.Get<LogicalOperatorType>()));
	deserializer.ReadPropertyWithDefault<idx_t>(201, "mark_index", result->mark_index);
	deserializer.ReadPropertyWithDefault<vector<idx_t>>(202, "left_projection_map", result->left_projection_map);
	deserializer.ReadPropertyWithDefault<vector<idx_t>>(203, "right_projection_map", result->right_projection_map);
	deserializer.ReadPropertyWithDefault<vector<JoinCondition>>(204, "conditions", result->conditions);
	deserializer.ReadPropertyWithDefault<vector<LogicalType>>(205, "mark_types", result->mark_types);
	deserializer.ReadPropertyWithDefault<vector<unique_ptr<Expression>>>(206, "duplicate_eliminated_columns", result->duplicate_eliminated_columns);
	deserializer.ReadPropertyWithExplicitDefault<bool>(207, "delim_flipped", result->delim_flipped, false);
	deserializer.ReadPropertyWithDefault<unique_ptr<Expression>>(208, "predicate", result->predicate);
	return std::move(result);
}